

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall HighsSymmetryDetection::initializeGroundSet(HighsSymmetryDetection *this)

{
  pointer piVar1;
  pointer piVar2;
  int *piVar3;
  int *piVar4;
  HighsInt i;
  int iVar5;
  long lVar6;
  value_type_conflict2 local_10 [2];
  
  std::vector<int,_std::allocator<int>_>::operator=(&this->vertexGroundSet,&this->currentPartition);
  pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
            ((this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_10[1] = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->vertexPosition,
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,local_10 + 1);
  piVar1 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar6 = 0; lVar6 < this->numVertices; lVar6 = lVar6 + 1) {
    piVar1[piVar2[lVar6]] = (int)lVar6;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->orbitPartition,(long)this->numVertices);
  piVar3 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar5 = 0;
  for (piVar4 = (this->orbitPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar3; piVar4 = piVar4 + 1) {
    *piVar4 = iVar5;
    iVar5 = iVar5 + 1;
  }
  local_10[0] = 1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->orbitSize,(long)this->numVertices,local_10);
  std::vector<int,_std::allocator<int>_>::resize(&this->automorphisms,(long)this->numVertices << 6);
  this->numAutomorphisms = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this->currNodeCertificate,(long)this->numVertices);
  return;
}

Assistant:

void HighsSymmetryDetection::initializeGroundSet() {
  vertexGroundSet = currentPartition;
  pdqsort(vertexGroundSet.begin(), vertexGroundSet.end());
  vertexPosition.resize(vertexToCell.size(), -1);
  for (HighsInt i = 0; i < numVertices; ++i)
    vertexPosition[vertexGroundSet[i]] = i;

  orbitPartition.resize(numVertices);
  std::iota(orbitPartition.begin(), orbitPartition.end(), 0);
  orbitSize.assign(numVertices, 1);

  automorphisms.resize(numVertices * 64);
  numAutomorphisms = 0;
  currNodeCertificate.reserve(numVertices);
}